

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O3

int __thiscall FTextureManager::CountTexturesX(FTextureManager *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FWadCollection *pFVar5;
  int wadnum;
  
  iVar1 = FWadCollection::GetNumWads(&Wads);
  if (iVar1 < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    wadnum = 0;
    do {
      iVar2 = FWadCollection::CheckNumForName(&Wads,"PNAMES",0,wadnum,false);
      if (-1 < iVar2) {
        pFVar5 = &Wads;
        iVar3 = FWadCollection::GetLumpFile(&Wads,iVar2);
        if (wadnum == iVar3) {
          iVar2 = CountLumpTextures((FTextureManager *)pFVar5,iVar2);
          iVar4 = iVar4 + iVar2;
        }
        iVar2 = FWadCollection::CheckNumForName(&Wads,"TEXTURE1",0,wadnum,true);
        pFVar5 = &Wads;
        iVar3 = FWadCollection::CheckNumForName(&Wads,"TEXTURE2",0,wadnum,true);
        iVar2 = CountLumpTextures((FTextureManager *)pFVar5,iVar2);
        iVar3 = CountLumpTextures((FTextureManager *)pFVar5,iVar3);
        iVar4 = iVar3 + iVar2 + iVar4 + -2;
      }
      wadnum = wadnum + 1;
    } while (iVar1 != wadnum);
  }
  return iVar4;
}

Assistant:

int FTextureManager::CountTexturesX ()
{
	int count = 0;
	int wadcount = Wads.GetNumWads();
	for (int wadnum = 0; wadnum < wadcount; wadnum++)
	{
		// Use the most recent PNAMES for this WAD.
		// Multiple PNAMES in a WAD will be ignored.
		int pnames = Wads.CheckNumForName("PNAMES", ns_global, wadnum, false);

		// should never happen except for zdoom.pk3
		if (pnames < 0) continue;

		// Only count the patches if the PNAMES come from the current file
		// Otherwise they have already been counted.
		if (Wads.GetLumpFile(pnames) == wadnum) 
		{
			count += CountLumpTextures (pnames);
		}

		int texlump1 = Wads.CheckNumForName ("TEXTURE1", ns_global, wadnum);
		int texlump2 = Wads.CheckNumForName ("TEXTURE2", ns_global, wadnum);

		count += CountLumpTextures (texlump1) - 1;
		count += CountLumpTextures (texlump2) - 1;
	}
	return count;
}